

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.cpp
# Opt level: O0

void __thiscall
Trie<char,26ul,(char)97>::add<std::__cxx11::string>
          (Trie<char,26ul,(char)97> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *word)

{
  int iVar1;
  reference pcVar2;
  Trie<char,_26UL,__a_> *this_00;
  bool local_35;
  const_iterator cStack_30;
  int index;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  const_iterator c;
  Trie<char,_26UL,__a_> *root;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *word_local;
  Trie<char,_26UL,__a_> *this_local;
  
  c._M_current = (char *)this;
  local_28._M_current = (char *)std::cbegin<std::__cxx11::string>(word);
  while( true ) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_28);
    local_35 = false;
    if (*pcVar2 != '\0') {
      cStack_30 = std::cend<std::__cxx11::string>(word);
      local_35 = __gnu_cxx::operator!=(&local_28,&stack0xffffffffffffffd0);
    }
    if (local_35 == false) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_28);
    iVar1 = *pcVar2 + -0x61;
    if (*(long *)(c._M_current + (long)iVar1 * 8) == 0) {
      this_00 = (Trie<char,_26UL,__a_> *)operator_new(0xd8);
      memset(this_00,0,0xd8);
      Trie<char,_26UL,_'a'>::Trie(this_00);
      *(Trie<char,_26UL,__a_> **)(c._M_current + (long)iVar1 * 8) = this_00;
    }
    c._M_current = c._M_current[(long)iVar1 * 8];
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_28);
  }
  *(long *)(c._M_current + 0xd0) = *(long *)(c._M_current + 0xd0) + 1;
  return;
}

Assistant:

void add(const Iteratable& word) {
    auto root = this;
    for (auto c = std::cbegin(word); *c and c != std::cend(word); ++c) {
      auto index = *c - offset;
      if (root->nodes[index] == nullptr) {
        root->nodes[index] = new Trie<Element, N, offset>();
      }
      root = root->nodes[index];
    }
    root->counter += 1;
  }